

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscache.cpp
# Opt level: O0

void __thiscall QNetworkAccessCache::clear(QNetworkAccessCache *this)

{
  bool bVar1;
  Node **ppNVar2;
  iterator *in_RDI;
  long in_FS_OFFSET;
  Iterator end;
  Iterator it;
  NodeHash hashCopy;
  QHash<QByteArray,_QNetworkAccessCache::Node_*> *in_stack_ffffffffffffffa8;
  iterator *in_stack_ffffffffffffffb0;
  QHash<QByteArray,_QNetworkAccessCache::Node_*> *this_00;
  Node *in_stack_ffffffffffffffb8;
  iterator *this_01;
  QHash<QByteArray,_QNetworkAccessCache::Node_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d = (Data *)0xaaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  QHash<QByteArray,_QNetworkAccessCache::Node_*>::QHash
            ((QHash<QByteArray,_QNetworkAccessCache::Node_*> *)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  QHash<QByteArray,_QNetworkAccessCache::Node_*>::clear
            ((QHash<QByteArray,_QNetworkAccessCache::Node_*> *)in_stack_ffffffffffffffb0);
  QHash<QByteArray,_QNetworkAccessCache::Node_*>::begin
            ((QHash<QByteArray,_QNetworkAccessCache::Node_*> *)this_01);
  QHash<QByteArray,_QNetworkAccessCache::Node_*>::end
            ((QHash<QByteArray,_QNetworkAccessCache::Node_*> *)in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = QHash<QByteArray,_QNetworkAccessCache::Node_*>::iterator::operator!=
                      ((iterator *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (!bVar1) break;
    QHash<QByteArray,_QNetworkAccessCache::Node_*>::iterator::operator*((iterator *)0x192eb4);
    QByteArray::clear();
    ppNVar2 = QHash<QByteArray,_QNetworkAccessCache::Node_*>::iterator::operator*
                        ((iterator *)0x192ece);
    (*(*ppNVar2)->object->_vptr_CacheableObject[2])();
    ppNVar2 = QHash<QByteArray,_QNetworkAccessCache::Node_*>::iterator::operator*
                        ((iterator *)0x192ee5);
    in_stack_ffffffffffffffb8 = *ppNVar2;
    if (in_stack_ffffffffffffffb8 != (Node *)0x0) {
      Node::~Node((Node *)0x192efd);
      operator_delete(in_stack_ffffffffffffffb8,0x48);
    }
    QHash<QByteArray,_QNetworkAccessCache::Node_*>::iterator::operator++(in_RDI);
  }
  this_00 = &local_10;
  QHash<QByteArray,_QNetworkAccessCache::Node_*>::clear(this_00);
  QBasicTimer::stop();
  in_RDI[2].i.d = (Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *)0x0;
  in_RDI[1].i.bucket = 0;
  QHash<QByteArray,_QNetworkAccessCache::Node_*>::~QHash(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessCache::clear()
{
    NodeHash hashCopy = hash;
    hash.clear();

    // remove all entries
    NodeHash::Iterator it = hashCopy.begin();
    NodeHash::Iterator end = hashCopy.end();
    for ( ; it != end; ++it) {
        (*it)->object->key.clear();
        (*it)->object->dispose();
        delete (*it);
    }

    // now delete:
    hashCopy.clear();

    timer.stop();

    firstExpiringNode = lastExpiringNode = nullptr;
}